

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.hpp
# Opt level: O2

FilePath * de::FilePath::join(FilePath *__return_storage_ptr__,FilePath *a,FilePath *b)

{
  string *psVar1;
  FilePath FStack_38;
  
  std::__cxx11::string::string((string *)&FStack_38,(string *)a);
  psVar1 = (string *)join(&FStack_38,b);
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  std::__cxx11::string::~string((string *)&FStack_38);
  return __return_storage_ptr__;
}

Assistant:

inline FilePath FilePath::join (const FilePath& a, const FilePath& b)
{
	return FilePath(a).join(b);
}